

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

int __thiscall xercesc_4_0::XMLDateTime::fillYearString(XMLDateTime *this,XMLCh **ptr,int value)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  XMLSize_t XVar3;
  ulong local_60;
  XMLSize_t i;
  XMLSize_t negativeYear;
  XMLSize_t actualLen;
  XMLCh strBuffer [16];
  int value_local;
  XMLCh **ptr_local;
  XMLDateTime *this_local;
  
  strBuffer._28_4_ = value;
  XMLString::binToText(value,(XMLCh *)&actualLen,0xf,10,this->fMemoryManager);
  XVar3 = XMLString::stringLen((XMLCh *)&actualLen);
  if ((short)actualLen == 0x2d) {
    pXVar2 = *ptr;
    *ptr = pXVar2 + 1;
    *pXVar2 = L'-';
  }
  i = (XMLSize_t)((short)actualLen == 0x2d);
  if (XVar3 + i < 4) {
    for (local_60 = 0; local_60 < (4 - XVar3) + i; local_60 = local_60 + 1) {
      pXVar2 = *ptr;
      *ptr = pXVar2 + 1;
      *pXVar2 = L'0';
    }
  }
  for (local_60 = i; local_60 < XVar3; local_60 = local_60 + 1) {
    XVar1 = strBuffer[local_60 - 4];
    pXVar2 = *ptr;
    *ptr = pXVar2 + 1;
    *pXVar2 = XVar1;
  }
  if (XVar3 < 5) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = (int)XVar3 + -4;
  }
  return this_local._4_4_;
}

Assistant:

int XMLDateTime::fillYearString(XMLCh*& ptr, int value) const
{
    XMLCh strBuffer[16];
    // let's hope we get no years of 15 digits...
    XMLString::binToText(value, strBuffer, 15, 10, fMemoryManager);
    XMLSize_t actualLen = XMLString::stringLen(strBuffer);
    // don't forget that years can be negative...
    XMLSize_t negativeYear = 0;
    if(strBuffer[0] == chDash)
    {
        *ptr++ = strBuffer[0];
        negativeYear = 1;
    }
    XMLSize_t i;
    //append leading zeros
    if(actualLen+negativeYear < 4)
        for (i = 0; i < 4 - actualLen+negativeYear; i++)
            *ptr++ = chDigit_0;

    for (i = negativeYear; i < actualLen; i++)
        *ptr++ = strBuffer[i];

    if(actualLen > 4)
        return (int)actualLen-4;
    return 0;
}